

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase270::run(TestCase270 *this)

{
  uint uVar1;
  bool bVar2;
  Type TVar3;
  uint uVar4;
  char *value;
  int *in_R8;
  ArrayPtr<const_char> AVar5;
  ArrayPtr<const_char> local_1f0;
  bool local_1d9;
  undefined1 auStack_1d8 [7];
  bool _kj_shouldLog_3;
  size_t local_1d0;
  int local_1c8;
  bool local_1c2;
  bool local_1c1;
  undefined1 local_1c0 [6];
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  StringPtr local_1b0;
  Type local_1a0 [2];
  bool local_195;
  bool _kj_shouldLog;
  String local_188;
  undefined1 local_170 [8];
  Exception exception;
  int line;
  int i;
  TestCase270 *this_local;
  
  exception._340_4_ = 0x7b;
  exception.traceCount = 0x111;
  Debug::makeDescription<char_const(&)[4],int&>
            (&local_188,(Debug *)"\"foo\", i","foo",(char (*) [4])&exception.field_0x154,in_R8);
  Exception::Exception
            ((Exception *)local_170,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,0x111,&local_188);
  String::~String(&local_188);
  TVar3 = Exception::getType((Exception *)local_170);
  if (TVar3 != DISCONNECTED) {
    local_195 = Debug::shouldLog(ERROR);
    while (local_195 != false) {
      local_1a0[1] = 2;
      local_1a0[0] = Exception::getType((Exception *)local_170);
      Debug::log<char_const(&)[74],kj::Exception::Type,kj::Exception::Type>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0x113,ERROR,
                 "\"failed: expected \" \"(Exception::Type::DISCONNECTED) == (exception.getType())\", Exception::Type::DISCONNECTED, exception.getType()"
                 ,(char (*) [74])
                  "failed: expected (Exception::Type::DISCONNECTED) == (exception.getType())",
                 local_1a0 + 1,local_1a0);
      local_195 = false;
    }
  }
  StringPtr::StringPtr
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
            );
  value = Exception::getFile((Exception *)local_170);
  StringPtr::StringPtr((StringPtr *)local_1c0,value);
  bVar2 = StringPtr::endsWith(&local_1b0,(StringPtr *)local_1c0);
  if (!bVar2) {
    local_1c1 = Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      Debug::log<char_const(&)[169]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0x114,ERROR,
                 "\"failed: expected \" \"kj::StringPtr(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\").endsWith(exception.getFile())\""
                 ,(char (*) [169])
                  "failed: expected kj::StringPtr(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\").endsWith(exception.getFile())"
                );
      local_1c1 = false;
    }
  }
  uVar1 = exception.traceCount;
  uVar4 = Exception::getLine((Exception *)local_170);
  if (uVar1 != uVar4) {
    local_1c2 = Debug::shouldLog(ERROR);
    while (local_1c2 != false) {
      local_1c8 = Exception::getLine((Exception *)local_170);
      Debug::log<char_const(&)[49],int&,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0x115,ERROR,
                 "\"failed: expected \" \"(line) == (exception.getLine())\", line, exception.getLine()"
                 ,(char (*) [49])"failed: expected (line) == (exception.getLine())",
                 (int *)&exception.traceCount,&local_1c8);
      local_1c2 = false;
    }
  }
  _auStack_1d8 = (ArrayPtr<const_char>)Exception::getDescription((Exception *)local_170);
  bVar2 = kj::operator==("foo; i = 123",(StringPtr *)auStack_1d8);
  if (!bVar2) {
    local_1d9 = Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      AVar5 = (ArrayPtr<const_char>)Exception::getDescription((Exception *)local_170);
      local_1f0 = AVar5;
      Debug::log<char_const(&)[66],char_const(&)[13],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                 ,0x116,ERROR,
                 "\"failed: expected \" \"(\\\"foo; i = 123\\\") == (exception.getDescription())\", \"foo; i = 123\", exception.getDescription()"
                 ,(char (*) [66])
                  "failed: expected (\"foo; i = 123\") == (exception.getDescription())",
                 (char (*) [13])"foo; i = 123",(StringPtr *)&local_1f0);
      local_1d9 = false;
    }
  }
  Exception::~Exception((Exception *)local_170);
  return;
}

Assistant:

TEST(Debug, Exception) {
  int i = 123;

  int line = __LINE__; Exception exception = KJ_EXCEPTION(DISCONNECTED, "foo", i);

  EXPECT_EQ(Exception::Type::DISCONNECTED, exception.getType());
  EXPECT_TRUE(kj::StringPtr(__FILE__).endsWith(exception.getFile()));
  EXPECT_EQ(line, exception.getLine());
  EXPECT_EQ("foo; i = 123", exception.getDescription());
}